

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O0

void aom_lpf_horizontal_8_quad_avx2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined8 *puVar90;
  ulong *puVar91;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  int in_ESI;
  ulong *in_RDI;
  undefined1 *in_R8;
  __m256i filter;
  __m256i res_q;
  __m256i res_p;
  __m256i sum_q;
  __m256i sum_p;
  __m256i pixetFilter_q2q1q0;
  __m256i q2q1q0;
  __m256i p2p1p0;
  __m256i pixetFilter_p2p1p0;
  __m256i four;
  __m128i work_1;
  __m128i flat_q2;
  __m128i flat_q1;
  __m128i flat_q0;
  __m128i flat_p0;
  __m128i flat_p1;
  __m128i flat_p2;
  __m128i filter2;
  __m128i filter1;
  __m128i work_a;
  __m128i filt;
  __m128i qs1;
  __m128i qs0;
  __m128i ps0;
  __m128i ps1;
  __m128i hev;
  __m128i one;
  __m128i t7f;
  __m128i t1;
  __m128i t1f;
  __m128i te0;
  __m128i t80;
  __m128i t3;
  __m128i t4;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i abs_q1q0;
  __m128i abs_p1p0;
  __m128i fe;
  __m128i work;
  __m128i ff;
  __m128i zero;
  __m128i blimit_v;
  __m128i limit_v;
  __m128i thresh_v;
  __m128i flat;
  __m128i mask;
  __m128i q3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m256i q256_0;
  __m256i p256_0;
  __m256i q256_1;
  __m256i p256_1;
  __m256i q256_2;
  __m256i p256_2;
  __m256i q256_3;
  __m256i p256_3;
  undefined8 local_25a0;
  ulong local_2370;
  ulong uStack_2368;
  undefined8 local_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  ulong local_22d0;
  ulong uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 local_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_1eb0;
  undefined8 uStack_1e90;
  ulong uStack_1e70;
  ulong uStack_1e50;
  ulong uStack_1e30;
  ulong uStack_1e10;
  undefined8 uStack_1df0;
  undefined8 uStack_1dd0;
  ulong local_11c0;
  ulong uStack_11b8;
  ulong local_11a0;
  ulong uStack_1198;
  ulong local_1180;
  ulong uStack_1178;
  ulong local_1160;
  ulong uStack_1158;
  ulong local_10c0;
  ulong uStack_10b8;
  ulong local_10a0;
  ulong uStack_1098;
  ulong local_140;
  ulong uStack_138;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar1 = *in_R8;
  uVar2 = *in_RCX;
  uVar3 = *in_RDX;
  auVar4 = vpcmpeqb_avx(ZEXT816(0),ZEXT816(0));
  auVar5 = vpinsrb_avx(ZEXT116(0xfe),0xfe,1);
  auVar5 = vpinsrb_avx(auVar5,0xfe,2);
  auVar5 = vpinsrb_avx(auVar5,0xfe,3);
  auVar5 = vpinsrb_avx(auVar5,0xfe,4);
  auVar5 = vpinsrb_avx(auVar5,0xfe,5);
  auVar5 = vpinsrb_avx(auVar5,0xfe,6);
  auVar5 = vpinsrb_avx(auVar5,0xfe,7);
  auVar5 = vpinsrb_avx(auVar5,0xfe,8);
  auVar5 = vpinsrb_avx(auVar5,0xfe,9);
  auVar5 = vpinsrb_avx(auVar5,0xfe,10);
  auVar5 = vpinsrb_avx(auVar5,0xfe,0xb);
  auVar5 = vpinsrb_avx(auVar5,0xfe,0xc);
  auVar5 = vpinsrb_avx(auVar5,0xfe,0xd);
  auVar5 = vpinsrb_avx(auVar5,0xfe,0xe);
  auVar6 = vpinsrb_avx(auVar5,0xfe,0xf);
  auVar64._8_8_ = uStack_1e10;
  auVar64._0_8_ = uStack_1e10;
  auVar5._8_8_ = uStack_1e30;
  auVar5._0_8_ = uStack_1e30;
  auVar5 = vpsubusb_avx(auVar64,auVar5);
  auVar63._8_8_ = uStack_1e30;
  auVar63._0_8_ = uStack_1e30;
  auVar62._8_8_ = uStack_1e10;
  auVar62._0_8_ = uStack_1e10;
  auVar12 = vpsubusb_avx(auVar63,auVar62);
  auVar5 = vpor_avx(auVar5,auVar12);
  auVar61._8_8_ = uStack_1e70;
  auVar61._0_8_ = uStack_1e70;
  auVar12._8_8_ = uStack_1e50;
  auVar12._0_8_ = uStack_1e50;
  auVar12 = vpsubusb_avx(auVar61,auVar12);
  auVar60._8_8_ = uStack_1e50;
  auVar60._0_8_ = uStack_1e50;
  auVar59._8_8_ = uStack_1e70;
  auVar59._0_8_ = uStack_1e70;
  auVar13 = vpsubusb_avx(auVar60,auVar59);
  auVar12 = vpor_avx(auVar12,auVar13);
  auVar58._8_8_ = uStack_1e30;
  auVar58._0_8_ = uStack_1e30;
  auVar57._8_8_ = uStack_1e50;
  auVar57._0_8_ = uStack_1e50;
  auVar13 = vpsubusb_avx(auVar58,auVar57);
  auVar56._8_8_ = uStack_1e50;
  auVar56._0_8_ = uStack_1e50;
  auVar55._8_8_ = uStack_1e30;
  auVar55._0_8_ = uStack_1e30;
  auVar14 = vpsubusb_avx(auVar56,auVar55);
  auVar13 = vpor_avx(auVar13,auVar14);
  auVar54._8_8_ = uStack_1e10;
  auVar54._0_8_ = uStack_1e10;
  auVar53._8_8_ = uStack_1e70;
  auVar53._0_8_ = uStack_1e70;
  auVar14 = vpsubusb_avx(auVar54,auVar53);
  auVar52._8_8_ = uStack_1e70;
  auVar52._0_8_ = uStack_1e70;
  auVar51._8_8_ = uStack_1e10;
  auVar51._0_8_ = uStack_1e10;
  auVar15 = vpsubusb_avx(auVar52,auVar51);
  auVar14 = vpor_avx(auVar14,auVar15);
  auVar12 = vpmaxub_avx(auVar5,auVar12);
  auVar5 = vpaddusb_avx(auVar13,auVar13);
  auVar6 = vpand_avx(auVar14,auVar6);
  auVar6 = vpsrlw_avx(auVar6,ZEXT416(1));
  auVar5 = vpaddusb_avx(auVar5,auVar6);
  auVar50[1] = uVar3;
  auVar50[0] = uVar3;
  auVar50[2] = uVar3;
  auVar50[3] = uVar3;
  auVar50[4] = uVar3;
  auVar50[5] = uVar3;
  auVar50[6] = uVar3;
  auVar50[7] = uVar3;
  auVar50[9] = uVar3;
  auVar50[8] = uVar3;
  auVar50[10] = uVar3;
  auVar50[0xb] = uVar3;
  auVar50[0xc] = uVar3;
  auVar50[0xd] = uVar3;
  auVar50[0xe] = uVar3;
  auVar50[0xf] = uVar3;
  auVar5 = vpsubusb_avx(auVar5,auVar50);
  auVar5 = vpcmpeqb_avx(auVar5,ZEXT816(0));
  local_2370 = auVar4._0_8_;
  uStack_2368 = auVar4._8_8_;
  local_10a0 = auVar5._0_8_;
  uStack_1098 = auVar5._8_8_;
  auVar65._8_8_ = uStack_1098 ^ uStack_2368;
  auVar65._0_8_ = local_10a0 ^ local_2370;
  auVar5 = vpmaxub_avx(auVar12,auVar65);
  auVar49._8_8_ = uStack_1df0;
  auVar49._0_8_ = uStack_1df0;
  auVar48._8_8_ = uStack_1e10;
  auVar48._0_8_ = uStack_1e10;
  auVar6 = vpsubusb_avx(auVar49,auVar48);
  auVar47._8_8_ = uStack_1e10;
  auVar47._0_8_ = uStack_1e10;
  auVar46._8_8_ = uStack_1df0;
  auVar46._0_8_ = uStack_1df0;
  auVar4 = vpsubusb_avx(auVar47,auVar46);
  auVar6 = vpor_avx(auVar6,auVar4);
  auVar45._8_8_ = uStack_1dd0;
  auVar45._0_8_ = uStack_1dd0;
  auVar44._8_8_ = uStack_1df0;
  auVar44._0_8_ = uStack_1df0;
  auVar4 = vpsubusb_avx(auVar45,auVar44);
  auVar43._8_8_ = uStack_1df0;
  auVar43._0_8_ = uStack_1df0;
  auVar11._8_8_ = uStack_1dd0;
  auVar11._0_8_ = uStack_1dd0;
  auVar13 = vpsubusb_avx(auVar43,auVar11);
  auVar4 = vpor_avx(auVar4,auVar13);
  auVar6 = vpmaxub_avx(auVar6,auVar4);
  auVar5 = vpmaxub_avx(auVar6,auVar5);
  auVar10._8_8_ = uStack_1e90;
  auVar10._0_8_ = uStack_1e90;
  auVar9._8_8_ = uStack_1e70;
  auVar9._0_8_ = uStack_1e70;
  auVar6 = vpsubusb_avx(auVar10,auVar9);
  auVar8._8_8_ = uStack_1e70;
  auVar8._0_8_ = uStack_1e70;
  auVar7._8_8_ = uStack_1e90;
  auVar7._0_8_ = uStack_1e90;
  auVar4 = vpsubusb_avx(auVar8,auVar7);
  auVar6 = vpor_avx(auVar6,auVar4);
  auVar15._8_8_ = uStack_1eb0;
  auVar15._0_8_ = uStack_1eb0;
  auVar4._8_8_ = uStack_1e90;
  auVar4._0_8_ = uStack_1e90;
  auVar4 = vpsubusb_avx(auVar15,auVar4);
  auVar14._8_8_ = uStack_1e90;
  auVar14._0_8_ = uStack_1e90;
  auVar13._8_8_ = uStack_1eb0;
  auVar13._0_8_ = uStack_1eb0;
  auVar13 = vpsubusb_avx(auVar14,auVar13);
  auVar4 = vpor_avx(auVar4,auVar13);
  auVar6 = vpmaxub_avx(auVar6,auVar4);
  auVar5 = vpmaxub_avx(auVar6,auVar5);
  auVar6[1] = uVar2;
  auVar6[0] = uVar2;
  auVar6[2] = uVar2;
  auVar6[3] = uVar2;
  auVar6[4] = uVar2;
  auVar6[5] = uVar2;
  auVar6[6] = uVar2;
  auVar6[7] = uVar2;
  auVar6[9] = uVar2;
  auVar6[8] = uVar2;
  auVar6[10] = uVar2;
  auVar6[0xb] = uVar2;
  auVar6[0xc] = uVar2;
  auVar6[0xd] = uVar2;
  auVar6[0xe] = uVar2;
  auVar6[0xf] = uVar2;
  auVar5 = vpsubusb_avx(auVar5,auVar6);
  auVar5 = vpcmpeqb_avx(auVar5,ZEXT816(0));
  auVar6 = vpcmpeqb_avx(auVar5,ZEXT816(0));
  if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
    auVar6 = vpinsrb_avx(ZEXT116(4),4,1);
    auVar6 = vpinsrb_avx(auVar6,4,2);
    auVar6 = vpinsrb_avx(auVar6,4,3);
    auVar6 = vpinsrb_avx(auVar6,4,4);
    auVar6 = vpinsrb_avx(auVar6,4,5);
    auVar6 = vpinsrb_avx(auVar6,4,6);
    auVar6 = vpinsrb_avx(auVar6,4,7);
    auVar6 = vpinsrb_avx(auVar6,4,8);
    auVar6 = vpinsrb_avx(auVar6,4,9);
    auVar6 = vpinsrb_avx(auVar6,4,10);
    auVar6 = vpinsrb_avx(auVar6,4,0xb);
    auVar6 = vpinsrb_avx(auVar6,4,0xc);
    auVar6 = vpinsrb_avx(auVar6,4,0xd);
    auVar6 = vpinsrb_avx(auVar6,4,0xe);
    auVar13 = vpinsrb_avx(auVar6,4,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar6 = vpinsrb_avx(auVar6,3,2);
    auVar6 = vpinsrb_avx(auVar6,3,3);
    auVar6 = vpinsrb_avx(auVar6,3,4);
    auVar6 = vpinsrb_avx(auVar6,3,5);
    auVar6 = vpinsrb_avx(auVar6,3,6);
    auVar6 = vpinsrb_avx(auVar6,3,7);
    auVar6 = vpinsrb_avx(auVar6,3,8);
    auVar6 = vpinsrb_avx(auVar6,3,9);
    auVar6 = vpinsrb_avx(auVar6,3,10);
    auVar6 = vpinsrb_avx(auVar6,3,0xb);
    auVar6 = vpinsrb_avx(auVar6,3,0xc);
    auVar6 = vpinsrb_avx(auVar6,3,0xd);
    auVar6 = vpinsrb_avx(auVar6,3,0xe);
    auVar14 = vpinsrb_avx(auVar6,3,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar6 = vpinsrb_avx(auVar6,0x80,2);
    auVar6 = vpinsrb_avx(auVar6,0x80,3);
    auVar6 = vpinsrb_avx(auVar6,0x80,4);
    auVar6 = vpinsrb_avx(auVar6,0x80,5);
    auVar6 = vpinsrb_avx(auVar6,0x80,6);
    auVar6 = vpinsrb_avx(auVar6,0x80,7);
    auVar6 = vpinsrb_avx(auVar6,0x80,8);
    auVar6 = vpinsrb_avx(auVar6,0x80,9);
    auVar6 = vpinsrb_avx(auVar6,0x80,10);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xb);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xc);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xd);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xe);
    auVar15 = vpinsrb_avx(auVar6,0x80,0xf);
    local_140 = auVar15._0_8_;
    uStack_138 = auVar15._8_8_;
    auVar6 = vpinsrb_avx(ZEXT116(0xe0),0xe0,1);
    auVar6 = vpinsrb_avx(auVar6,0xe0,2);
    auVar6 = vpinsrb_avx(auVar6,0xe0,3);
    auVar6 = vpinsrb_avx(auVar6,0xe0,4);
    auVar6 = vpinsrb_avx(auVar6,0xe0,5);
    auVar6 = vpinsrb_avx(auVar6,0xe0,6);
    auVar6 = vpinsrb_avx(auVar6,0xe0,7);
    auVar6 = vpinsrb_avx(auVar6,0xe0,8);
    auVar6 = vpinsrb_avx(auVar6,0xe0,9);
    auVar6 = vpinsrb_avx(auVar6,0xe0,10);
    auVar6 = vpinsrb_avx(auVar6,0xe0,0xb);
    auVar6 = vpinsrb_avx(auVar6,0xe0,0xc);
    auVar6 = vpinsrb_avx(auVar6,0xe0,0xd);
    auVar6 = vpinsrb_avx(auVar6,0xe0,0xe);
    auVar7 = vpinsrb_avx(auVar6,0xe0,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(0x1f),0x1f,1);
    auVar6 = vpinsrb_avx(auVar6,0x1f,2);
    auVar6 = vpinsrb_avx(auVar6,0x1f,3);
    auVar6 = vpinsrb_avx(auVar6,0x1f,4);
    auVar6 = vpinsrb_avx(auVar6,0x1f,5);
    auVar6 = vpinsrb_avx(auVar6,0x1f,6);
    auVar6 = vpinsrb_avx(auVar6,0x1f,7);
    auVar6 = vpinsrb_avx(auVar6,0x1f,8);
    auVar6 = vpinsrb_avx(auVar6,0x1f,9);
    auVar6 = vpinsrb_avx(auVar6,0x1f,10);
    auVar6 = vpinsrb_avx(auVar6,0x1f,0xb);
    auVar6 = vpinsrb_avx(auVar6,0x1f,0xc);
    auVar6 = vpinsrb_avx(auVar6,0x1f,0xd);
    auVar6 = vpinsrb_avx(auVar6,0x1f,0xe);
    auVar8 = vpinsrb_avx(auVar6,0x1f,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar6 = vpinsrb_avx(auVar6,1,2);
    auVar6 = vpinsrb_avx(auVar6,1,3);
    auVar6 = vpinsrb_avx(auVar6,1,4);
    auVar6 = vpinsrb_avx(auVar6,1,5);
    auVar6 = vpinsrb_avx(auVar6,1,6);
    auVar6 = vpinsrb_avx(auVar6,1,7);
    auVar6 = vpinsrb_avx(auVar6,1,8);
    auVar6 = vpinsrb_avx(auVar6,1,9);
    auVar6 = vpinsrb_avx(auVar6,1,10);
    auVar6 = vpinsrb_avx(auVar6,1,0xb);
    auVar6 = vpinsrb_avx(auVar6,1,0xc);
    auVar6 = vpinsrb_avx(auVar6,1,0xd);
    auVar6 = vpinsrb_avx(auVar6,1,0xe);
    auVar9 = vpinsrb_avx(auVar6,1,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
    auVar6 = vpinsrb_avx(auVar6,0x7f,2);
    auVar6 = vpinsrb_avx(auVar6,0x7f,3);
    auVar6 = vpinsrb_avx(auVar6,0x7f,4);
    auVar6 = vpinsrb_avx(auVar6,0x7f,5);
    auVar6 = vpinsrb_avx(auVar6,0x7f,6);
    auVar6 = vpinsrb_avx(auVar6,0x7f,7);
    auVar6 = vpinsrb_avx(auVar6,0x7f,8);
    auVar6 = vpinsrb_avx(auVar6,0x7f,9);
    auVar6 = vpinsrb_avx(auVar6,0x7f,10);
    auVar6 = vpinsrb_avx(auVar6,0x7f,0xb);
    auVar6 = vpinsrb_avx(auVar6,0x7f,0xc);
    auVar6 = vpinsrb_avx(auVar6,0x7f,0xd);
    auVar6 = vpinsrb_avx(auVar6,0x7f,0xe);
    auVar10 = vpinsrb_avx(auVar6,0x7f,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar6 = vpinsrb_avx(auVar6,1,2);
    auVar6 = vpinsrb_avx(auVar6,1,3);
    auVar6 = vpinsrb_avx(auVar6,1,4);
    auVar6 = vpinsrb_avx(auVar6,1,5);
    auVar6 = vpinsrb_avx(auVar6,1,6);
    auVar6 = vpinsrb_avx(auVar6,1,7);
    auVar6 = vpinsrb_avx(auVar6,1,8);
    auVar6 = vpinsrb_avx(auVar6,1,9);
    auVar6 = vpinsrb_avx(auVar6,1,10);
    auVar6 = vpinsrb_avx(auVar6,1,0xb);
    auVar6 = vpinsrb_avx(auVar6,1,0xc);
    auVar6 = vpinsrb_avx(auVar6,1,0xd);
    auVar6 = vpinsrb_avx(auVar6,1,0xe);
    auVar11 = vpinsrb_avx(auVar6,1,0xf);
    auVar42[1] = uVar1;
    auVar42[0] = uVar1;
    auVar42[2] = uVar1;
    auVar42[3] = uVar1;
    auVar42[4] = uVar1;
    auVar42[5] = uVar1;
    auVar42[6] = uVar1;
    auVar42[7] = uVar1;
    auVar42[9] = uVar1;
    auVar42[8] = uVar1;
    auVar42[10] = uVar1;
    auVar42[0xb] = uVar1;
    auVar42[0xc] = uVar1;
    auVar42[0xd] = uVar1;
    auVar42[0xe] = uVar1;
    auVar42[0xf] = uVar1;
    auVar6 = vpsubusb_avx(auVar12,auVar42);
    auVar6 = vpcmpeqb_avx(auVar6,ZEXT816(0));
    local_10c0 = auVar6._0_8_;
    uStack_10b8 = auVar6._8_8_;
    auVar72._8_8_ = uStack_1e10 ^ uStack_138;
    auVar72._0_8_ = uStack_1e10 ^ local_140;
    auVar71._8_8_ = uStack_1e70 ^ uStack_138;
    auVar71._0_8_ = uStack_1e70 ^ local_140;
    auVar6 = vpsubsb_avx(auVar72,auVar71);
    auVar66._8_8_ = uStack_10b8 ^ uStack_2368;
    auVar66._0_8_ = local_10c0 ^ local_2370;
    auVar6 = vpand_avx(auVar6,auVar66);
    auVar70._8_8_ = uStack_1e50 ^ uStack_138;
    auVar70._0_8_ = uStack_1e50 ^ local_140;
    auVar69._8_8_ = uStack_1e30 ^ uStack_138;
    auVar69._0_8_ = uStack_1e30 ^ local_140;
    auVar4 = vpsubsb_avx(auVar70,auVar69);
    auVar6 = vpaddsb_avx(auVar6,auVar4);
    auVar6 = vpaddsb_avx(auVar6,auVar4);
    auVar6 = vpaddsb_avx(auVar6,auVar4);
    auVar4 = vpand_avx(auVar6,auVar5);
    auVar6 = vpaddsb_avx(auVar4,auVar13);
    auVar4 = vpaddsb_avx(auVar4,auVar14);
    auVar13 = vpcmpgtb_avx(ZEXT816(0),auVar6);
    auVar14 = vpsrlw_avx(auVar6,ZEXT416(3));
    auVar6 = vpand_avx(auVar13,auVar7);
    auVar13 = vpand_avx(auVar14,auVar8);
    auVar13 = vpor_avx(auVar13,auVar6);
    auVar68._8_8_ = uStack_1e50 ^ uStack_138;
    auVar68._0_8_ = uStack_1e50 ^ local_140;
    auVar6 = vpsubsb_avx(auVar68,auVar13);
    local_1160 = auVar6._0_8_;
    uStack_1158 = auVar6._8_8_;
    auVar6 = vpcmpgtb_avx(ZEXT816(0),auVar4);
    auVar4 = vpsrlw_avx(auVar4,ZEXT416(3));
    auVar6 = vpand_avx(auVar6,auVar7);
    auVar4 = vpand_avx(auVar4,auVar8);
    auVar6 = vpor_avx(auVar4,auVar6);
    auVar74._8_8_ = uStack_1e30 ^ uStack_138;
    auVar74._0_8_ = uStack_1e30 ^ local_140;
    auVar6 = vpaddsb_avx(auVar74,auVar6);
    local_1180 = auVar6._0_8_;
    uStack_1178 = auVar6._8_8_;
    auVar6 = vpaddsb_avx(auVar13,auVar9);
    auVar4 = vpcmpgtb_avx(ZEXT816(0),auVar6);
    auVar13 = vpsrlw_avx(auVar6,ZEXT416(1));
    auVar6 = vpand_avx(auVar4,auVar15);
    auVar4 = vpand_avx(auVar13,auVar10);
    auVar6 = vpor_avx(auVar4,auVar6);
    auVar81._8_8_ = uStack_10b8 ^ uStack_2368;
    auVar81._0_8_ = local_10c0 ^ local_2370;
    auVar4 = vpandn_avx(auVar81,auVar6);
    auVar73._8_8_ = uStack_1e10 ^ uStack_138;
    auVar73._0_8_ = uStack_1e10 ^ local_140;
    auVar6 = vpaddsb_avx(auVar73,auVar4);
    local_11a0 = auVar6._0_8_;
    uStack_1198 = auVar6._8_8_;
    auVar67._8_8_ = uStack_1e70 ^ uStack_138;
    auVar67._0_8_ = uStack_1e70 ^ local_140;
    auVar6 = vpsubsb_avx(auVar67,auVar4);
    local_11c0 = auVar6._0_8_;
    uStack_11b8 = auVar6._8_8_;
    auVar41._8_8_ = uStack_1df0;
    auVar41._0_8_ = uStack_1df0;
    auVar40._8_8_ = uStack_1e30;
    auVar40._0_8_ = uStack_1e30;
    auVar6 = vpsubusb_avx(auVar41,auVar40);
    auVar39._8_8_ = uStack_1e30;
    auVar39._0_8_ = uStack_1e30;
    auVar38._8_8_ = uStack_1df0;
    auVar38._0_8_ = uStack_1df0;
    auVar4 = vpsubusb_avx(auVar39,auVar38);
    auVar6 = vpor_avx(auVar6,auVar4);
    auVar37._8_8_ = uStack_1e90;
    auVar37._0_8_ = uStack_1e90;
    auVar36._8_8_ = uStack_1e50;
    auVar36._0_8_ = uStack_1e50;
    auVar4 = vpsubusb_avx(auVar37,auVar36);
    auVar35._8_8_ = uStack_1e50;
    auVar35._0_8_ = uStack_1e50;
    auVar34._8_8_ = uStack_1e90;
    auVar34._0_8_ = uStack_1e90;
    auVar13 = vpsubusb_avx(auVar35,auVar34);
    auVar4 = vpor_avx(auVar4,auVar13);
    auVar6 = vpmaxub_avx(auVar6,auVar4);
    auVar6 = vpmaxub_avx(auVar6,auVar12);
    auVar33._8_8_ = uStack_1dd0;
    auVar33._0_8_ = uStack_1dd0;
    auVar32._8_8_ = uStack_1e30;
    auVar32._0_8_ = uStack_1e30;
    auVar4 = vpsubusb_avx(auVar33,auVar32);
    auVar31._8_8_ = uStack_1e30;
    auVar31._0_8_ = uStack_1e30;
    auVar30._8_8_ = uStack_1dd0;
    auVar30._0_8_ = uStack_1dd0;
    auVar12 = vpsubusb_avx(auVar31,auVar30);
    auVar4 = vpor_avx(auVar4,auVar12);
    auVar29._8_8_ = uStack_1eb0;
    auVar29._0_8_ = uStack_1eb0;
    auVar28._8_8_ = uStack_1e50;
    auVar28._0_8_ = uStack_1e50;
    auVar12 = vpsubusb_avx(auVar29,auVar28);
    auVar27._8_8_ = uStack_1e50;
    auVar27._0_8_ = uStack_1e50;
    auVar26._8_8_ = uStack_1eb0;
    auVar26._0_8_ = uStack_1eb0;
    auVar13 = vpsubusb_avx(auVar27,auVar26);
    auVar12 = vpor_avx(auVar12,auVar13);
    auVar4 = vpmaxub_avx(auVar4,auVar12);
    auVar6 = vpmaxub_avx(auVar4,auVar6);
    auVar6 = vpsubusb_avx(auVar6,auVar11);
    auVar6 = vpcmpeqb_avx(auVar6,ZEXT816(0));
    auVar5 = vpand_avx(auVar6,auVar5);
    auVar6 = vpcmpeqb_avx(auVar5,ZEXT816(0));
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
      puVar91 = (ulong *)((long)in_RDI - (long)(in_ESI << 1));
      *puVar91 = local_11a0 ^ local_140;
      puVar91[1] = uStack_1198 ^ uStack_138;
      *(ulong *)((long)in_RDI - (long)in_ESI) = local_1180 ^ local_140;
      ((ulong *)((long)in_RDI - (long)in_ESI))[1] = uStack_1178 ^ uStack_138;
      *in_RDI = local_1160 ^ local_140;
      in_RDI[1] = uStack_1158 ^ uStack_138;
      *(ulong *)((long)in_RDI + (long)in_ESI) = local_11c0 ^ local_140;
      ((ulong *)((long)in_RDI + (long)in_ESI))[1] = uStack_11b8 ^ uStack_138;
    }
    else {
      auVar6 = vpinsrw_avx(ZEXT216(4),4,1);
      auVar6 = vpinsrw_avx(auVar6,4,2);
      auVar6 = vpinsrw_avx(auVar6,4,3);
      auVar6 = vpinsrw_avx(auVar6,4,4);
      auVar6 = vpinsrw_avx(auVar6,4,5);
      auVar6 = vpinsrw_avx(auVar6,4,6);
      auVar6 = vpinsrw_avx(auVar6,4,7);
      auVar4 = vpinsrw_avx(ZEXT216(4),4,1);
      auVar4 = vpinsrw_avx(auVar4,4,2);
      auVar4 = vpinsrw_avx(auVar4,4,3);
      auVar4 = vpinsrw_avx(auVar4,4,4);
      auVar4 = vpinsrw_avx(auVar4,4,5);
      auVar4 = vpinsrw_avx(auVar4,4,6);
      auVar4 = vpinsrw_avx(auVar4,4,7);
      uStack_70 = auVar4._0_8_;
      uStack_68 = auVar4._8_8_;
      auVar87._8_8_ = uStack_1dd0;
      auVar87._0_8_ = uStack_1dd0;
      auVar87._16_8_ = uStack_1dd0;
      auVar87._24_8_ = uStack_1dd0;
      auVar18[8] = '\x04';
      auVar18[9] = 0x80;
      auVar18[10] = '\x05';
      auVar18[0xb] = 0x80;
      auVar18[0xc] = '\x06';
      auVar18[0xd] = 0x80;
      auVar18[0xe] = '\a';
      auVar18[0xf] = 0x80;
      auVar18[0] = '\0';
      auVar18[1] = 0x80;
      auVar18[2] = '\x01';
      auVar18[3] = 0x80;
      auVar18[4] = '\x02';
      auVar18[5] = 0x80;
      auVar18[6] = '\x03';
      auVar18[7] = 0x80;
      auVar18[0x10] = '\b';
      auVar18[0x11] = 0x80;
      auVar18[0x12] = '\t';
      auVar18[0x13] = 0x80;
      auVar18[0x14] = '\n';
      auVar18[0x15] = 0x80;
      auVar18[0x16] = '\v';
      auVar18[0x17] = 0x80;
      auVar18[0x18] = '\f';
      auVar18[0x19] = 0x80;
      auVar18[0x1a] = '\r';
      auVar18[0x1b] = 0x80;
      auVar18[0x1c] = '\x0e';
      auVar18[0x1d] = 0x80;
      auVar18[0x1e] = '\x0f';
      auVar18[0x1f] = 0x80;
      auVar18 = vpshufb_avx2(auVar87,auVar18);
      auVar86._8_8_ = uStack_1df0;
      auVar86._0_8_ = uStack_1df0;
      auVar86._16_8_ = uStack_1df0;
      auVar86._24_8_ = uStack_1df0;
      auVar19[8] = '\x04';
      auVar19[9] = 0x80;
      auVar19[10] = '\x05';
      auVar19[0xb] = 0x80;
      auVar19[0xc] = '\x06';
      auVar19[0xd] = 0x80;
      auVar19[0xe] = '\a';
      auVar19[0xf] = 0x80;
      auVar19[0] = '\0';
      auVar19[1] = 0x80;
      auVar19[2] = '\x01';
      auVar19[3] = 0x80;
      auVar19[4] = '\x02';
      auVar19[5] = 0x80;
      auVar19[6] = '\x03';
      auVar19[7] = 0x80;
      auVar19[0x10] = '\b';
      auVar19[0x11] = 0x80;
      auVar19[0x12] = '\t';
      auVar19[0x13] = 0x80;
      auVar19[0x14] = '\n';
      auVar19[0x15] = 0x80;
      auVar19[0x16] = '\v';
      auVar19[0x17] = 0x80;
      auVar19[0x18] = '\f';
      auVar19[0x19] = 0x80;
      auVar19[0x1a] = '\r';
      auVar19[0x1b] = 0x80;
      auVar19[0x1c] = '\x0e';
      auVar19[0x1d] = 0x80;
      auVar19[0x1e] = '\x0f';
      auVar19[0x1f] = 0x80;
      auVar19 = vpshufb_avx2(auVar86,auVar19);
      auVar85._8_8_ = uStack_1e10;
      auVar85._0_8_ = uStack_1e10;
      auVar85._16_8_ = uStack_1e10;
      auVar85._24_8_ = uStack_1e10;
      auVar20[8] = '\x04';
      auVar20[9] = 0x80;
      auVar20[10] = '\x05';
      auVar20[0xb] = 0x80;
      auVar20[0xc] = '\x06';
      auVar20[0xd] = 0x80;
      auVar20[0xe] = '\a';
      auVar20[0xf] = 0x80;
      auVar20[0] = '\0';
      auVar20[1] = 0x80;
      auVar20[2] = '\x01';
      auVar20[3] = 0x80;
      auVar20[4] = '\x02';
      auVar20[5] = 0x80;
      auVar20[6] = '\x03';
      auVar20[7] = 0x80;
      auVar20[0x10] = '\b';
      auVar20[0x11] = 0x80;
      auVar20[0x12] = '\t';
      auVar20[0x13] = 0x80;
      auVar20[0x14] = '\n';
      auVar20[0x15] = 0x80;
      auVar20[0x16] = '\v';
      auVar20[0x17] = 0x80;
      auVar20[0x18] = '\f';
      auVar20[0x19] = 0x80;
      auVar20[0x1a] = '\r';
      auVar20[0x1b] = 0x80;
      auVar20[0x1c] = '\x0e';
      auVar20[0x1d] = 0x80;
      auVar20[0x1e] = '\x0f';
      auVar20[0x1f] = 0x80;
      auVar20 = vpshufb_avx2(auVar85,auVar20);
      auVar84._8_8_ = uStack_1e30;
      auVar84._0_8_ = uStack_1e30;
      auVar84._16_8_ = uStack_1e30;
      auVar84._24_8_ = uStack_1e30;
      auVar21[8] = '\x04';
      auVar21[9] = 0x80;
      auVar21[10] = '\x05';
      auVar21[0xb] = 0x80;
      auVar21[0xc] = '\x06';
      auVar21[0xd] = 0x80;
      auVar21[0xe] = '\a';
      auVar21[0xf] = 0x80;
      auVar21[0] = '\0';
      auVar21[1] = 0x80;
      auVar21[2] = '\x01';
      auVar21[3] = 0x80;
      auVar21[4] = '\x02';
      auVar21[5] = 0x80;
      auVar21[6] = '\x03';
      auVar21[7] = 0x80;
      auVar21[0x10] = '\b';
      auVar21[0x11] = 0x80;
      auVar21[0x12] = '\t';
      auVar21[0x13] = 0x80;
      auVar21[0x14] = '\n';
      auVar21[0x15] = 0x80;
      auVar21[0x16] = '\v';
      auVar21[0x17] = 0x80;
      auVar21[0x18] = '\f';
      auVar21[0x19] = 0x80;
      auVar21[0x1a] = '\r';
      auVar21[0x1b] = 0x80;
      auVar21[0x1c] = '\x0e';
      auVar21[0x1d] = 0x80;
      auVar21[0x1e] = '\x0f';
      auVar21[0x1f] = 0x80;
      auVar21 = vpshufb_avx2(auVar84,auVar21);
      auVar83._8_8_ = uStack_1e50;
      auVar83._0_8_ = uStack_1e50;
      auVar83._16_8_ = uStack_1e50;
      auVar83._24_8_ = uStack_1e50;
      auVar22[8] = '\x04';
      auVar22[9] = 0x80;
      auVar22[10] = '\x05';
      auVar22[0xb] = 0x80;
      auVar22[0xc] = '\x06';
      auVar22[0xd] = 0x80;
      auVar22[0xe] = '\a';
      auVar22[0xf] = 0x80;
      auVar22[0] = '\0';
      auVar22[1] = 0x80;
      auVar22[2] = '\x01';
      auVar22[3] = 0x80;
      auVar22[4] = '\x02';
      auVar22[5] = 0x80;
      auVar22[6] = '\x03';
      auVar22[7] = 0x80;
      auVar22[0x10] = '\b';
      auVar22[0x11] = 0x80;
      auVar22[0x12] = '\t';
      auVar22[0x13] = 0x80;
      auVar22[0x14] = '\n';
      auVar22[0x15] = 0x80;
      auVar22[0x16] = '\v';
      auVar22[0x17] = 0x80;
      auVar22[0x18] = '\f';
      auVar22[0x19] = 0x80;
      auVar22[0x1a] = '\r';
      auVar22[0x1b] = 0x80;
      auVar22[0x1c] = '\x0e';
      auVar22[0x1d] = 0x80;
      auVar22[0x1e] = '\x0f';
      auVar22[0x1f] = 0x80;
      auVar22 = vpshufb_avx2(auVar83,auVar22);
      auVar82._8_8_ = uStack_1e70;
      auVar82._0_8_ = uStack_1e70;
      auVar82._16_8_ = uStack_1e70;
      auVar82._24_8_ = uStack_1e70;
      auVar23[8] = '\x04';
      auVar23[9] = 0x80;
      auVar23[10] = '\x05';
      auVar23[0xb] = 0x80;
      auVar23[0xc] = '\x06';
      auVar23[0xd] = 0x80;
      auVar23[0xe] = '\a';
      auVar23[0xf] = 0x80;
      auVar23[0] = '\0';
      auVar23[1] = 0x80;
      auVar23[2] = '\x01';
      auVar23[3] = 0x80;
      auVar23[4] = '\x02';
      auVar23[5] = 0x80;
      auVar23[6] = '\x03';
      auVar23[7] = 0x80;
      auVar23[0x10] = '\b';
      auVar23[0x11] = 0x80;
      auVar23[0x12] = '\t';
      auVar23[0x13] = 0x80;
      auVar23[0x14] = '\n';
      auVar23[0x15] = 0x80;
      auVar23[0x16] = '\v';
      auVar23[0x17] = 0x80;
      auVar23[0x18] = '\f';
      auVar23[0x19] = 0x80;
      auVar23[0x1a] = '\r';
      auVar23[0x1b] = 0x80;
      auVar23[0x1c] = '\x0e';
      auVar23[0x1d] = 0x80;
      auVar23[0x1e] = '\x0f';
      auVar23[0x1f] = 0x80;
      auVar23 = vpshufb_avx2(auVar82,auVar23);
      auVar25._8_8_ = uStack_1e90;
      auVar25._0_8_ = uStack_1e90;
      auVar25._16_8_ = uStack_1e90;
      auVar25._24_8_ = uStack_1e90;
      auVar24[8] = '\x04';
      auVar24[9] = 0x80;
      auVar24[10] = '\x05';
      auVar24[0xb] = 0x80;
      auVar24[0xc] = '\x06';
      auVar24[0xd] = 0x80;
      auVar24[0xe] = '\a';
      auVar24[0xf] = 0x80;
      auVar24[0] = '\0';
      auVar24[1] = 0x80;
      auVar24[2] = '\x01';
      auVar24[3] = 0x80;
      auVar24[4] = '\x02';
      auVar24[5] = 0x80;
      auVar24[6] = '\x03';
      auVar24[7] = 0x80;
      auVar24[0x10] = '\b';
      auVar24[0x11] = 0x80;
      auVar24[0x12] = '\t';
      auVar24[0x13] = 0x80;
      auVar24[0x14] = '\n';
      auVar24[0x15] = 0x80;
      auVar24[0x16] = '\v';
      auVar24[0x17] = 0x80;
      auVar24[0x18] = '\f';
      auVar24[0x19] = 0x80;
      auVar24[0x1a] = '\r';
      auVar24[0x1b] = 0x80;
      auVar24[0x1c] = '\x0e';
      auVar24[0x1d] = 0x80;
      auVar24[0x1e] = '\x0f';
      auVar24[0x1f] = 0x80;
      auVar24 = vpshufb_avx2(auVar25,auVar24);
      auVar17._8_8_ = uStack_1eb0;
      auVar17._0_8_ = uStack_1eb0;
      auVar17._16_8_ = uStack_1eb0;
      auVar17._24_8_ = uStack_1eb0;
      auVar16[8] = '\x04';
      auVar16[9] = 0x80;
      auVar16[10] = '\x05';
      auVar16[0xb] = 0x80;
      auVar16[0xc] = '\x06';
      auVar16[0xd] = 0x80;
      auVar16[0xe] = '\a';
      auVar16[0xf] = 0x80;
      auVar16[0] = '\0';
      auVar16[1] = 0x80;
      auVar16[2] = '\x01';
      auVar16[3] = 0x80;
      auVar16[4] = '\x02';
      auVar16[5] = 0x80;
      auVar16[6] = '\x03';
      auVar16[7] = 0x80;
      auVar16[0x10] = '\b';
      auVar16[0x11] = 0x80;
      auVar16[0x12] = '\t';
      auVar16[0x13] = 0x80;
      auVar16[0x14] = '\n';
      auVar16[0x15] = 0x80;
      auVar16[0x16] = '\v';
      auVar16[0x17] = 0x80;
      auVar16[0x18] = '\f';
      auVar16[0x19] = 0x80;
      auVar16[0x1a] = '\r';
      auVar16[0x1b] = 0x80;
      auVar16[0x1c] = '\x0e';
      auVar16[0x1d] = 0x80;
      auVar16[0x1e] = '\x0f';
      auVar16[0x1f] = 0x80;
      auVar25 = vpshufb_avx2(auVar17,auVar16);
      auVar16 = vpaddw_avx2(auVar19,auVar20);
      auVar16 = vpaddw_avx2(auVar21,auVar16);
      auVar17 = vpaddw_avx2(auVar24,auVar23);
      auVar17 = vpaddw_avx2(auVar22,auVar17);
      auVar16 = vpaddw_avx2(auVar16,auVar17);
      auVar89._16_8_ = uStack_70;
      auVar89._0_16_ = auVar6;
      auVar89._24_8_ = uStack_68;
      auVar16 = vpaddw_avx2(auVar89,auVar16);
      local_25a0 = auVar16._0_8_;
      auVar17 = vpaddw_avx2(auVar16,auVar18);
      auVar16 = vpaddw_avx2(auVar17,auVar21);
      auVar16 = vpsrlw_avx2(auVar16,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar12 = vpcmpeqd_avx(auVar5,auVar5);
      auVar80._8_8_ = uStack_1178 ^ uStack_138;
      auVar80._0_8_ = local_1180 ^ local_140;
      auVar4 = vpandn_avx(auVar5,auVar80);
      auVar6 = vpand_avx(auVar5,auVar16._0_16_);
      auVar13 = vpor_avx(auVar6,auVar4);
      auVar88._8_8_ = local_25a0;
      auVar88._0_8_ = local_25a0;
      auVar88._16_8_ = local_25a0;
      auVar88._24_8_ = local_25a0;
      auVar21 = vpaddw_avx2(auVar88,auVar25);
      auVar16 = vpaddw_avx2(auVar21,auVar22);
      auVar16 = vpsrlw_avx2(auVar16,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar79._8_8_ = uStack_1158 ^ uStack_138;
      auVar79._0_8_ = local_1160 ^ local_140;
      auVar4 = vpandn_avx(auVar5,auVar79);
      auVar6 = vpand_avx(auVar5,auVar16._0_16_);
      auVar14 = vpor_avx(auVar6,auVar4);
      auVar16 = vpsubw_avx2(auVar18,auVar24);
      auVar17 = vpaddw_avx2(auVar17,auVar16);
      auVar16 = vpaddw_avx2(auVar17,auVar20);
      auVar16 = vpsrlw_avx2(auVar16,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar78._8_8_ = uStack_1198 ^ uStack_138;
      auVar78._0_8_ = local_11a0 ^ local_140;
      auVar4 = vpandn_avx(auVar5,auVar78);
      auVar6 = vpand_avx(auVar5,auVar16._0_16_);
      auVar15 = vpor_avx(auVar6,auVar4);
      auVar16 = vpsubw_avx2(auVar25,auVar19);
      auVar21 = vpaddw_avx2(auVar21,auVar16);
      auVar16 = vpaddw_avx2(auVar21,auVar23);
      auVar16 = vpsrlw_avx2(auVar16,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar77._8_8_ = uStack_11b8 ^ uStack_138;
      auVar77._0_8_ = local_11c0 ^ local_140;
      auVar4 = vpandn_avx(auVar5,auVar77);
      auVar6 = vpand_avx(auVar5,auVar16._0_16_);
      auVar7 = vpor_avx(auVar6,auVar4);
      auVar16 = vpsubw_avx2(auVar18,auVar23);
      auVar16 = vpaddw_avx2(auVar17,auVar16);
      auVar16 = vpaddw_avx2(auVar16,auVar19);
      auVar16 = vpsrlw_avx2(auVar16,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar76._8_8_ = uStack_1df0;
      auVar76._0_8_ = uStack_1df0;
      auVar4 = vpandn_avx(auVar5,auVar76);
      auVar6 = vpand_avx(auVar5,auVar16._0_16_);
      auVar4 = vpor_avx(auVar6,auVar4);
      auVar16 = vpsubw_avx2(auVar25,auVar20);
      auVar16 = vpaddw_avx2(auVar21,auVar16);
      auVar16 = vpaddw_avx2(auVar16,auVar24);
      auVar16 = vpsrlw_avx2(auVar16,ZEXT416(3));
      auVar16 = vpackuswb_avx2(auVar16,ZEXT432(3));
      auVar16 = vpermq_avx2(auVar16,0xa8);
      auVar75._8_8_ = uStack_1e90;
      auVar75._0_8_ = uStack_1e90;
      auVar6 = vpand_avx(auVar5 ^ auVar12,auVar75);
      auVar5 = vpand_avx(auVar5,auVar16._0_16_);
      auVar5 = vpor_avx(auVar5,auVar6);
      puVar90 = (undefined8 *)((long)in_RDI - (long)(in_ESI * 3));
      local_22a0 = auVar4._0_8_;
      uStack_2298 = auVar4._8_8_;
      *puVar90 = local_22a0;
      puVar90[1] = uStack_2298;
      puVar90 = (undefined8 *)((long)in_RDI - (long)(in_ESI << 1));
      local_22b0 = auVar15._0_8_;
      uStack_22a8 = auVar15._8_8_;
      *puVar90 = local_22b0;
      puVar90[1] = uStack_22a8;
      local_22c0 = auVar13._0_8_;
      uStack_22b8 = auVar13._8_8_;
      *(undefined8 *)((long)in_RDI - (long)in_ESI) = local_22c0;
      ((undefined8 *)((long)in_RDI - (long)in_ESI))[1] = uStack_22b8;
      local_22d0 = auVar14._0_8_;
      uStack_22c8 = auVar14._8_8_;
      *in_RDI = local_22d0;
      in_RDI[1] = uStack_22c8;
      local_22e0 = auVar7._0_8_;
      uStack_22d8 = auVar7._8_8_;
      *(undefined8 *)((long)in_RDI + (long)in_ESI) = local_22e0;
      ((undefined8 *)((long)in_RDI + (long)in_ESI))[1] = uStack_22d8;
      puVar90 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 1));
      local_22f0 = auVar5._0_8_;
      uStack_22e8 = auVar5._8_8_;
      *puVar90 = local_22f0;
      puVar90[1] = uStack_22e8;
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_8_quad_avx2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0) {
  __m256i p256_3, q256_3, p256_2, q256_2, p256_1, q256_1, p256_0, q256_0;
  __m128i p3, p2, p1, p0, q0, q1, q2, q3;
  __m128i mask, flat;

  const __m128i thresh_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_thresh0[0]));
  const __m128i limit_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_limit0[0]));
  const __m128i blimit_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_blimit0[0]));
  const __m128i zero = _mm_setzero_si128();
  const __m128i ff = _mm_cmpeq_epi8(zero, zero);

  p256_3 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 4 * p)));
  p256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 3 * p)));
  p256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 2 * p)));
  p256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 1 * p)));
  q256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 0 * p)));
  q256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 1 * p)));
  q256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 2 * p)));
  q256_3 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 3 * p)));

  p3 = _mm256_castsi256_si128(p256_3);
  p2 = _mm256_castsi256_si128(p256_2);
  p1 = _mm256_castsi256_si128(p256_1);
  p0 = _mm256_castsi256_si128(p256_0);
  q0 = _mm256_castsi256_si128(q256_0);
  q1 = _mm256_castsi256_si128(q256_1);
  q2 = _mm256_castsi256_si128(q256_2);
  q3 = _mm256_castsi256_si128(q256_3);

  {
    __m128i work;
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i abs_p1p0 =
        _mm_or_si128(_mm_subs_epu8(p1, p0), _mm_subs_epu8(p0, p1));
    const __m128i abs_q1q0 =
        _mm_or_si128(_mm_subs_epu8(q1, q0), _mm_subs_epu8(q0, q1));
    __m128i abs_p0q0 =
        _mm_or_si128(_mm_subs_epu8(p0, q0), _mm_subs_epu8(q0, p0));
    __m128i abs_p1q1 =
        _mm_or_si128(_mm_subs_epu8(p1, q1), _mm_subs_epu8(q1, p1));

    flat = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(flat, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p1), _mm_subs_epu8(p1, p2)),
        _mm_or_si128(_mm_subs_epu8(p3, p2), _mm_subs_epu8(p2, p3)));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(q2, q1), _mm_subs_epu8(q1, q2)),
        _mm_or_si128(_mm_subs_epu8(q3, q2), _mm_subs_epu8(q2, q3)));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  // loop filter
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i one = _mm_set1_epi8(1);
    __m128i hev;

    hev = _mm_subs_epu8(flat, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);

    __m128i ps1 = _mm_xor_si128(p1, t80);
    __m128i ps0 = _mm_xor_si128(p0, t80);
    __m128i qs0 = _mm_xor_si128(q0, t80);
    __m128i qs1 = _mm_xor_si128(q1, t80);
    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;
    __m128i flat_p2, flat_p1, flat_p0, flat_q0, flat_q1, flat_q2;

    filt = _mm_and_si128(_mm_subs_epi8(ps1, qs1), hev);
    work_a = _mm_subs_epi8(qs0, ps0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);

    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    qs0 = _mm_xor_si128(_mm_subs_epi8(qs0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    ps0 = _mm_xor_si128(_mm_adds_epi8(ps0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    ps1 = _mm_xor_si128(_mm_adds_epi8(ps1, filt), t80);
    qs1 = _mm_xor_si128(_mm_subs_epi8(qs1, filt), t80);

    __m128i work;
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p0), _mm_subs_epu8(p0, p2)),
        _mm_or_si128(_mm_subs_epu8(q2, q0), _mm_subs_epu8(q0, q2)));
    flat = _mm_max_epu8(work, flat);
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p3, p0), _mm_subs_epu8(p0, p3)),
        _mm_or_si128(_mm_subs_epu8(q3, q0), _mm_subs_epu8(q0, q3)));
    flat = _mm_max_epu8(work, flat);
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);

    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m256i four = _mm256_set1_epi16(4);
      __m256i pixetFilter_p2p1p0, p2p1p0, q2q1q0, pixetFilter_q2q1q0, sum_p,
          sum_q, res_p, res_q;

      const __m256i filter =
          _mm256_load_si256((__m256i const *)filt_loopfilter_avx2);

      p256_3 = _mm256_shuffle_epi8(p256_3, filter);
      p256_2 = _mm256_shuffle_epi8(p256_2, filter);
      p256_1 = _mm256_shuffle_epi8(p256_1, filter);
      p256_0 = _mm256_shuffle_epi8(p256_0, filter);
      q256_0 = _mm256_shuffle_epi8(q256_0, filter);
      q256_1 = _mm256_shuffle_epi8(q256_1, filter);
      q256_2 = _mm256_shuffle_epi8(q256_2, filter);
      q256_3 = _mm256_shuffle_epi8(q256_3, filter);

      p2p1p0 = _mm256_add_epi16(p256_0, _mm256_add_epi16(p256_2, p256_1));
      q2q1q0 = _mm256_add_epi16(q256_0, _mm256_add_epi16(q256_2, q256_1));

      pixetFilter_p2p1p0 =
          _mm256_add_epi16(four, _mm256_add_epi16(p2p1p0, q2q1q0));
      pixetFilter_q2q1q0 = pixetFilter_p2p1p0;

      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, p256_3);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_0), 3);
      flat_p0 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_p), 168));
      p0 = _mm_andnot_si128(flat, ps0);
      flat_p0 = _mm_and_si128(flat, flat_p0);
      p0 = _mm_or_si128(flat_p0, p0);

      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, q256_3);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_0), 3);
      flat_q0 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_q, res_q), 168));
      q0 = _mm_andnot_si128(flat, qs0);
      flat_q0 = _mm_and_si128(flat, flat_q0);
      q0 = _mm_or_si128(flat_q0, q0);

      sum_p = _mm256_sub_epi16(p256_3, q256_2);
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, sum_p);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_1), 3);
      flat_p1 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_p), 168));
      p1 = _mm_andnot_si128(flat, ps1);
      flat_p1 = _mm_and_si128(flat, flat_p1);
      p1 = _mm_or_si128(flat_p1, p1);

      sum_q = _mm256_sub_epi16(q256_3, p256_2);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, sum_q);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_1), 3);
      flat_q1 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_q, res_q), 168));
      q1 = _mm_andnot_si128(flat, qs1);
      flat_q1 = _mm_and_si128(flat, flat_q1);
      q1 = _mm_or_si128(flat_q1, q1);

      sum_p = _mm256_sub_epi16(p256_3, q256_1);
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, sum_p);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_2), 3);
      flat_p2 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_p), 168));
      p2 = _mm_andnot_si128(flat, p2);
      flat_p2 = _mm_and_si128(flat, flat_p2);
      p2 = _mm_or_si128(flat_p2, p2);

      sum_q = _mm256_sub_epi16(q256_3, p256_1);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, sum_q);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_2), 3);
      flat_q2 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_q, res_q), 168));
      q2 = _mm_andnot_si128(flat, q2);
      flat_q2 = _mm_and_si128(flat, flat_q2);
      q2 = _mm_or_si128(flat_q2, q2);

      _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
      _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), q0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
      _mm_storeu_si128((__m128i *)(s + 2 * p), q2);
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), ps1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), ps0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), qs0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), qs1);
    }
  }
}